

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

unsigned_short * __thiscall
r_code::vector<unsigned_short>::operator[](vector<unsigned_short> *this,size_t i)

{
  pointer puVar1;
  ulong uVar2;
  
  puVar1 = (this->m_vector).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_vector).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
  if (uVar2 <= i) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->m_vector,i + 1);
    puVar1 = (this->m_vector).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_vector).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
  }
  if (i < uVar2) {
    return puVar1 + i;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }